

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fixBoundingBox(Rtree *pRtree,RtreeNode *pNode)

{
  byte bVar1;
  byte bVar2;
  RtreeNode *pNode_00;
  int iVar3;
  uint iCell;
  long in_FS_OFFSET;
  RtreeCell cell;
  RtreeCell box;
  uint local_9c;
  RtreeCell local_98;
  RtreeCell local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNode_00 = pNode->pParent;
  if (pNode_00 == (RtreeNode *)0x0) {
    iVar3 = 0;
  }
  else {
    local_9c = 0xaaaaaaaa;
    bVar1 = pNode->zData[2];
    bVar2 = pNode->zData[3];
    local_68.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
    local_68.aCoord[0].i = -1;
    local_68.aCoord[1].i = -1;
    local_68.aCoord[2].i = -1;
    local_68.aCoord[3].i = -1;
    local_68.aCoord[4].i = -1;
    local_68.aCoord[5].i = -1;
    local_68.aCoord[6].i = -1;
    local_68.aCoord[7].i = -1;
    local_68.aCoord[8] = (RtreeCoord)0xffffffff;
    local_68.aCoord[9] = (RtreeCoord)0xffffffff;
    nodeGetCell(pRtree,pNode,0,&local_68);
    iCell = 1;
    if (1 < (uint)bVar1 * 0x100 + (uint)bVar2) {
      do {
        local_98.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
        local_98.aCoord[4].i = -1;
        local_98.aCoord[5].i = -1;
        local_98.aCoord[6].i = -1;
        local_98.aCoord[7].i = -1;
        local_98.aCoord[0].i = -1;
        local_98.aCoord[1].i = -1;
        local_98.aCoord[2].i = -1;
        local_98.aCoord[3].i = -1;
        local_98.aCoord[8] = (RtreeCoord)0xffffffff;
        local_98.aCoord[9] = (RtreeCoord)0xffffffff;
        nodeGetCell(pRtree,pNode,iCell,&local_98);
        cellUnion(pRtree,&local_68,&local_98);
        iCell = iCell + 1;
      } while (CONCAT11(bVar1,bVar2) != iCell);
    }
    local_68.iRowid = pNode->iNode;
    local_9c = iCell;
    iVar3 = nodeRowidIndex(pRtree,pNode_00,local_68.iRowid,(int *)&local_9c);
    if (iVar3 == 0) {
      nodeOverwriteCell(pRtree,pNode_00,&local_68,local_9c);
      iVar3 = fixBoundingBox(pRtree,pNode_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int fixBoundingBox(Rtree *pRtree, RtreeNode *pNode){
  RtreeNode *pParent = pNode->pParent;
  int rc = SQLITE_OK;
  if( pParent ){
    int ii;
    int nCell = NCELL(pNode);
    RtreeCell box;                            /* Bounding box for pNode */
    nodeGetCell(pRtree, pNode, 0, &box);
    for(ii=1; ii<nCell; ii++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, ii, &cell);
      cellUnion(pRtree, &box, &cell);
    }
    box.iRowid = pNode->iNode;
    rc = nodeParentIndex(pRtree, pNode, &ii);
    if( rc==SQLITE_OK ){
      nodeOverwriteCell(pRtree, pParent, &box, ii);
      rc = fixBoundingBox(pRtree, pParent);
    }
  }
  return rc;
}